

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O2

void __thiscall
Js::StepController::HandleResumeAction
          (StepController *this,InterpreterHaltState *haltState,BREAKRESUMEACTION resumeAction)

{
  uint uVar1;
  
  ResetReturnedValueList(this);
  uVar1 = resumeAction - BREAKRESUMEACTION_STEP_INTO;
  if ((uVar1 < 5) && ((0x17U >> (uVar1 & 0x1f) & 1) != 0)) {
    Activate(this,(StepType)(0x801040201 >> ((char)uVar1 * '\b' & 0x3fU)),haltState);
    return;
  }
  return;
}

Assistant:

void StepController::HandleResumeAction(Js::InterpreterHaltState* haltState, BREAKRESUMEACTION resumeAction)
    {
        ResetReturnedValueList();
        switch (resumeAction)
        {
        case BREAKRESUMEACTION_STEP_INTO:
            Activate(Js::STEP_IN, haltState);
            break;
        case BREAKRESUMEACTION_STEP_OVER:
            Activate(Js::STEP_OVER, haltState);
            break;
        case BREAKRESUMEACTION_STEP_OUT:
            Activate(Js::STEP_OUT, haltState);
            break;
        case BREAKRESUMEACTION_STEP_DOCUMENT:
            Activate(Js::STEP_DOCUMENT, haltState);
            break;
        }
    }